

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

BaseStatistics *
duckdb::NumericStats::CreateUnknown(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LStack_98;
  LogicalType local_80;
  Value local_68;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&local_28);
  LogicalType::~LogicalType(&local_28);
  __return_storage_ptr__->has_null = true;
  __return_storage_ptr__->has_no_null = true;
  LogicalType::LogicalType(&local_80,&__return_storage_ptr__->type);
  Value::Value(&local_68,&local_80);
  SetNumericValueInternal
            (&local_68,&__return_storage_ptr__->type,
             &(__return_storage_ptr__->stats_union).numeric_data.min,
             (bool *)&__return_storage_ptr__->stats_union);
  Value::~Value(&local_68);
  LogicalType::~LogicalType(&local_80);
  LogicalType::LogicalType(&LStack_98,&__return_storage_ptr__->type);
  Value::Value(&local_68,&LStack_98);
  SetNumericValueInternal
            (&local_68,&__return_storage_ptr__->type,
             &(__return_storage_ptr__->stats_union).numeric_data.max,
             &(__return_storage_ptr__->stats_union).numeric_data.has_max);
  Value::~Value(&local_68);
  LogicalType::~LogicalType(&LStack_98);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics NumericStats::CreateUnknown(LogicalType type) {
	BaseStatistics result(std::move(type));
	result.InitializeUnknown();
	SetMin(result, Value(result.GetType()));
	SetMax(result, Value(result.GetType()));
	return result;
}